

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::js::api::json::AddScriptHashSignTxInRequest::AddScriptHashSignTxInRequest
          (AddScriptHashSignTxInRequest *this)

{
  allocator local_26;
  allocator local_25 [20];
  allocator local_11;
  AddScriptHashSignTxInRequest *local_10;
  AddScriptHashSignTxInRequest *this_local;
  
  local_10 = this;
  core::JsonClassBase<cfd::js::api::json::AddScriptHashSignTxInRequest>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::AddScriptHashSignTxInRequest>);
  (this->super_JsonClassBase<cfd::js::api::json::AddScriptHashSignTxInRequest>)._vptr_JsonClassBase
       = (_func_int **)&PTR__AddScriptHashSignTxInRequest_01b41598;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->txid_,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  this->vout_ = 0;
  core::JsonObjectVector<cfd::js::api::json::SignData,_cfd::js::api::SignDataStruct>::
  JsonObjectVector(&this->sign_params_);
  core::JsonObjectVector<cfd::js::api::json::SignData,_cfd::js::api::SignDataStruct>::
  JsonObjectVector(&this->sign_param_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->redeem_script_,"",local_25);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->hash_type_,"",&local_26);
  std::allocator<char>::~allocator((allocator<char> *)&local_26);
  CollectFieldName();
  return;
}

Assistant:

AddScriptHashSignTxInRequest() {
    CollectFieldName();
  }